

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# varint_casts.cpp
# Opt level: O2

string_t __thiscall duckdb::IntToVarInt<short>(duckdb *this,Vector *result,short int_value)

{
  short sVar1;
  long lVar2;
  undefined6 in_register_00000012;
  idx_t len;
  idx_t extraout_RDX;
  ulong uVar3;
  ulong uVar4;
  char *blob_00;
  char **ppcVar5;
  __type_conflict8 _Var6;
  double dVar7;
  string_t blob;
  
  len = CONCAT62(in_register_00000012,int_value);
  sVar1 = (short)result;
  if (sVar1 < 0) {
    uVar3 = -(long)sVar1;
  }
  else {
    uVar3 = (ulong)result & 0xffff;
    if (sVar1 == 0) {
      uVar4 = 1;
      uVar3 = 0;
      goto LAB_01787949;
    }
  }
  _Var6 = ::std::log2<unsigned_long>(uVar3 + 1);
  dVar7 = ceil(_Var6 * 0.125);
  uVar4 = (ulong)dVar7;
  len = extraout_RDX;
LAB_01787949:
  blob = StringVector::EmptyString((StringVector *)this,(Vector *)(ulong)((int)uVar4 + 3),len);
  blob_00 = blob.value._8_8_;
  if (blob.value._0_4_ < 0xd) {
    blob_00 = blob.value.pointer.prefix;
  }
  Varint::SetHeader(blob_00,uVar4 & 0xffffffff,SUB81(((ulong)result & 0xffff) >> 0xf,0));
  lVar2 = (uVar4 & 0xffffffff) * 8;
  ppcVar5 = (char **)(blob_00 + 3);
  while( true ) {
    lVar2 = lVar2 + -8;
    if ((int)uVar4 < 1) break;
    *(byte *)ppcVar5 = (byte)(uVar3 >> ((byte)lVar2 & 0x3f)) ^ (byte)((uint)(int)sVar1 >> 0xf);
    uVar4 = (ulong)((int)uVar4 - 1);
    ppcVar5 = (char **)((long)ppcVar5 + 1);
  }
  string_t::Finalize(&blob);
  return (string_t)blob.value;
}

Assistant:

string_t IntToVarInt(Vector &result, T int_value) {
	// Determine if the number is negative
	bool is_negative = int_value < 0;
	// Determine the number of data bytes
	uint64_t abs_value;
	if (is_negative) {
		if (int_value == std::numeric_limits<T>::min()) {
			abs_value = static_cast<uint64_t>(std::numeric_limits<T>::max()) + 1;
		} else {
			abs_value = static_cast<uint64_t>(std::abs(static_cast<int64_t>(int_value)));
		}
	} else {
		abs_value = static_cast<uint64_t>(int_value);
	}
	uint32_t data_byte_size;
	if (abs_value != NumericLimits<uint64_t>::Maximum()) {
		data_byte_size = (abs_value == 0) ? 1 : static_cast<uint32_t>(std::ceil(std::log2(abs_value + 1) / 8.0));
	} else {
		data_byte_size = static_cast<uint32_t>(std::ceil(std::log2(abs_value) / 8.0));
	}

	uint32_t blob_size = data_byte_size + Varint::VARINT_HEADER_SIZE;
	auto blob = StringVector::EmptyString(result, blob_size);
	auto writable_blob = blob.GetDataWriteable();
	Varint::SetHeader(writable_blob, data_byte_size, is_negative);

	// Add data bytes to the blob, starting off after header bytes
	idx_t wb_idx = Varint::VARINT_HEADER_SIZE;
	for (int i = static_cast<int>(data_byte_size) - 1; i >= 0; --i) {
		if (is_negative) {
			writable_blob[wb_idx++] = static_cast<char>(~(abs_value >> i * 8 & 0xFF));
		} else {
			writable_blob[wb_idx++] = static_cast<char>(abs_value >> i * 8 & 0xFF);
		}
	}
	blob.Finalize();
	return blob;
}